

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFilter_constructors_Test::~TEST_TestFilter_constructors_Test
          (TEST_TestFilter_constructors_Test *this)

{
  TEST_TestFilter_constructors_Test *this_local;
  
  ~TEST_TestFilter_constructors_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(TestFilter, constructors)
{
    TestFilter filter1;
    TestFilter filter2(SimpleString("a"));
    TestFilter filter3("a");
    CHECK(filter1.getNext() == NULLPTR);
    CHECK(filter2.getNext() == NULLPTR);
    CHECK(filter3.getNext() == NULLPTR);
    CHECK(filter2.match("ab"));
    CHECK(filter3.match("ab"));
}